

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labels_solver.h
# Opt level: O3

double UF::Alloc(uint max_length,PerformanceEvaluator *perf)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  ulong __n;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  lVar4 = cv::getTickCount();
  (perf->counter_).last = (double)lVar4;
  __n = (ulong)max_length << 2;
  P_ = (uint *)operator_new__(__n);
  memset(P_,0,__n);
  lVar4 = cv::getTickCount();
  dVar3 = perf->tick_frequency_;
  dVar1 = (double)lVar4 - (perf->counter_).last;
  (perf->counter_).last = dVar1;
  (perf->counter_).total = (perf->counter_).total + dVar1;
  lVar4 = cv::getTickCount();
  (perf->counter_).last = (double)lVar4;
  memset(P_,0,__n);
  lVar4 = cv::getTickCount();
  dVar2 = (double)lVar4 - (perf->counter_).last;
  (perf->counter_).last = dVar2;
  auVar5._0_8_ = dVar1 * 1000.0;
  auVar5._8_8_ = dVar2 * 1000.0;
  (perf->counter_).total = dVar2 + (perf->counter_).total;
  auVar6._8_4_ = SUB84(perf->tick_frequency_,0);
  auVar6._0_8_ = dVar3;
  auVar6._12_4_ = (int)((ulong)perf->tick_frequency_ >> 0x20);
  auVar6 = divpd(auVar5,auVar6);
  return auVar6._0_8_ - auVar6._8_8_;
}

Assistant:

static double Alloc(unsigned max_length, PerformanceEvaluator& perf) {
        perf.start();
        P_ = new unsigned[max_length];
        memset(P_, 0, max_length * sizeof(unsigned));
        perf.stop();
        double t = perf.last();
        perf.start();
        memset(P_, 0, max_length * sizeof(unsigned));
        perf.stop();
        return t - perf.last();
    }